

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.hpp
# Opt level: O0

void __thiscall
Qentem::BigInt<unsigned_long_long,_256U>::ShiftLeft
          (BigInt<unsigned_long_long,_256U> *this,SizeT32 offset)

{
  byte bVar1;
  SizeT32 SVar2;
  SizeT32 SVar3;
  byte bVar4;
  ulong uVar5;
  unsigned_long_long carry;
  SizeT32 shift_size;
  SizeT32 index_1;
  SizeT32 diff;
  SizeT32 index;
  SizeT32 move;
  SizeT32 offset_local;
  BigInt<unsigned_long_long,_256U> *this_local;
  
  SVar2 = TypeWidth();
  index = offset;
  if (SVar2 <= offset) {
    SVar2 = TypeWidth();
    diff = offset / SVar2;
    SVar2 = TypeWidth();
    index = offset - diff * SVar2;
    index_1 = diff + this->index_;
    SVar2 = MaxIndex();
    if (SVar2 < index_1) {
      SVar2 = MaxIndex();
      if (this->index_ < index_1 - SVar2) {
        Clear(this);
        return;
      }
      this->index_ = this->index_ - (index_1 - SVar2);
      index_1 = MaxIndex();
    }
    this->storage_[this->index_ + diff] = this->storage_[this->index_];
    while (this->index_ != 0) {
      this->index_ = this->index_ - 1;
      this->storage_[this->index_ + diff] = this->storage_[this->index_];
    }
    do {
      diff = diff - 1;
      this->storage_[diff] = 0;
    } while (diff != 0);
    for (; this->storage_[index_1] == 0; index_1 = index_1 - 1) {
    }
    this->index_ = index_1;
  }
  if (index != 0) {
    carry._4_4_ = this->index_;
    SVar2 = TypeWidth();
    bVar1 = (byte)index;
    bVar4 = (char)SVar2 - bVar1;
    uVar5 = this->storage_[carry._4_4_] >> (bVar4 & 0x3f);
    this->storage_[carry._4_4_] = this->storage_[carry._4_4_] << (bVar1 & 0x3f);
    SVar2 = this->index_;
    SVar3 = MaxIndex();
    if (SVar2 != SVar3) {
      this->index_ = (uint)(uVar5 != 0) + this->index_;
      this->storage_[this->index_] = uVar5 | this->storage_[this->index_];
    }
    while (carry._4_4_ != 0) {
      this->storage_[carry._4_4_] =
           this->storage_[carry._4_4_ - 1] >> (bVar4 & 0x3f) | this->storage_[carry._4_4_];
      carry._4_4_ = carry._4_4_ - 1;
      this->storage_[carry._4_4_] = this->storage_[carry._4_4_] << (bVar1 & 0x3f);
    }
  }
  return;
}

Assistant:

inline void ShiftLeft(SizeT32 offset) noexcept {
        if (offset >= TypeWidth()) {
            SizeT32 move = (offset / TypeWidth());
            offset -= (move * TypeWidth());

            SizeT32 index = index_;
            index += move;

            if (index > MaxIndex()) {
                const SizeT32 diff = (index - MaxIndex());

                if (diff <= index_) {
                    index_ -= diff;
                    index = MaxIndex();
                } else {
                    Clear();
                    return;
                }
            }

            storage_[index_ + move] = storage_[index_];

            while (index_ != 0U) {
                --index_;
                storage_[index_ + move] = storage_[index_];
            }

            do {
                --move;
                storage_[move] = 0;
            } while (move != 0U);

            while (storage_[index] == 0) {
                --index;
            }

            index_ = index;
        }

        if (offset != 0U) {
            SizeT32        index      = index_;
            const SizeT32  shift_size = (TypeWidth() - offset);
            const Number_T carry      = (storage_[index] >> shift_size);

            storage_[index] <<= offset;

            if (index_ != MaxIndex()) {
                index_ += SizeT32(carry != 0);
                storage_[index_] |= carry;
            }

            while (index != 0U) {
                storage_[index] |= (storage_[index - 1U] >> shift_size);
                --index;
                storage_[index] <<= offset;
            }
        }
    }